

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetFilterTypeLiteralName(FILTER_TYPE FilterType,bool bGetFullName)

{
  Char *Message;
  char (*in_R8) [2];
  uint local_3c;
  undefined1 local_38 [8];
  string msg;
  bool bGetFullName_local;
  char *pcStack_10;
  FILTER_TYPE FilterType_local;
  
  switch(FilterType) {
  case FILTER_TYPE_UNKNOWN:
    pcStack_10 = "unknown";
    if (bGetFullName) {
      pcStack_10 = "FILTER_TYPE_UNKNOWN";
    }
    break;
  case FILTER_TYPE_POINT:
    pcStack_10 = "point";
    if (bGetFullName) {
      pcStack_10 = "FILTER_TYPE_POINT";
    }
    break;
  case FILTER_TYPE_LINEAR:
    pcStack_10 = "linear";
    if (bGetFullName) {
      pcStack_10 = "FILTER_TYPE_LINEAR";
    }
    break;
  case FILTER_TYPE_ANISOTROPIC:
    pcStack_10 = "anisotropic";
    if (bGetFullName) {
      pcStack_10 = "FILTER_TYPE_ANISOTROPIC";
    }
    break;
  case FILTER_TYPE_COMPARISON_POINT:
    pcStack_10 = "comparison point";
    if (bGetFullName) {
      pcStack_10 = "FILTER_TYPE_COMPARISON_POINT";
    }
    break;
  case FILTER_TYPE_COMPARISON_LINEAR:
    pcStack_10 = "comparison linear";
    if (bGetFullName) {
      pcStack_10 = "FILTER_TYPE_COMPARISON_LINEAR";
    }
    break;
  case FILTER_TYPE_COMPARISON_ANISOTROPIC:
    pcStack_10 = "comparison anisotropic";
    if (bGetFullName) {
      pcStack_10 = "FILTER_TYPE_COMPARISON_ANISOTROPIC";
    }
    break;
  case FILTER_TYPE_MINIMUM_POINT:
    pcStack_10 = "minimum point";
    if (bGetFullName) {
      pcStack_10 = "FILTER_TYPE_MINIMUM_POINT";
    }
    break;
  case FILTER_TYPE_MINIMUM_LINEAR:
    pcStack_10 = "minimum linear";
    if (bGetFullName) {
      pcStack_10 = "FILTER_TYPE_MINIMUM_LINEAR";
    }
    break;
  case FILTER_TYPE_MINIMUM_ANISOTROPIC:
    pcStack_10 = "minimum anisotropic";
    if (bGetFullName) {
      pcStack_10 = "FILTER_TYPE_MINIMUM_ANISOTROPIC";
    }
    break;
  case FILTER_TYPE_MAXIMUM_POINT:
    pcStack_10 = "maximum point";
    if (bGetFullName) {
      pcStack_10 = "FILTER_TYPE_MAXIMUM_POINT";
    }
    break;
  case FILTER_TYPE_MAXIMUM_LINEAR:
    pcStack_10 = "maximum linear";
    if (bGetFullName) {
      pcStack_10 = "FILTER_TYPE_MAXIMUM_LINEAR";
    }
    break;
  case FILTER_TYPE_MAXIMUM_ANISOTROPIC:
    pcStack_10 = "maximum anisotropic";
    if (bGetFullName) {
      pcStack_10 = "FILTER_TYPE_MAXIMUM_ANISOTROPIC";
    }
    break;
  default:
    local_3c = (uint)FilterType;
    msg.field_2._M_local_buf[0xe] = bGetFullName;
    msg.field_2._M_local_buf[0xf] = FilterType;
    FormatString<char[25],unsigned_int,char[2]>
              ((string *)local_38,(Diligent *)"Unexpected filter type (",(char (*) [25])&local_3c,
               (uint *)0xcabce5,in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetFilterTypeLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x38a);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const Char* GetFilterTypeLiteralName(FILTER_TYPE FilterType, bool bGetFullName)
{
    static_assert(FILTER_TYPE_NUM_FILTERS == 13, "Please update the switch below to handle the new filter type");
    switch (FilterType)
    {
        // clang-format off
        case FILTER_TYPE_UNKNOWN:                return bGetFullName ? "FILTER_TYPE_UNKNOWN"                : "unknown";
        case FILTER_TYPE_POINT:                  return bGetFullName ? "FILTER_TYPE_POINT"                  : "point";
        case FILTER_TYPE_LINEAR:                 return bGetFullName ? "FILTER_TYPE_LINEAR"                 : "linear";
        case FILTER_TYPE_ANISOTROPIC:            return bGetFullName ? "FILTER_TYPE_ANISOTROPIC"            : "anisotropic";
        case FILTER_TYPE_COMPARISON_POINT:       return bGetFullName ? "FILTER_TYPE_COMPARISON_POINT"       : "comparison point";
        case FILTER_TYPE_COMPARISON_LINEAR:      return bGetFullName ? "FILTER_TYPE_COMPARISON_LINEAR"      : "comparison linear";
        case FILTER_TYPE_COMPARISON_ANISOTROPIC: return bGetFullName ? "FILTER_TYPE_COMPARISON_ANISOTROPIC" : "comparison anisotropic";
        case FILTER_TYPE_MINIMUM_POINT:          return bGetFullName ? "FILTER_TYPE_MINIMUM_POINT"          : "minimum point";
        case FILTER_TYPE_MINIMUM_LINEAR:         return bGetFullName ? "FILTER_TYPE_MINIMUM_LINEAR"         : "minimum linear";
        case FILTER_TYPE_MINIMUM_ANISOTROPIC:    return bGetFullName ? "FILTER_TYPE_MINIMUM_ANISOTROPIC"    : "minimum anisotropic";
        case FILTER_TYPE_MAXIMUM_POINT:          return bGetFullName ? "FILTER_TYPE_MAXIMUM_POINT"          : "maximum point";
        case FILTER_TYPE_MAXIMUM_LINEAR:         return bGetFullName ? "FILTER_TYPE_MAXIMUM_LINEAR"         : "maximum linear";
        case FILTER_TYPE_MAXIMUM_ANISOTROPIC:    return bGetFullName ? "FILTER_TYPE_MAXIMUM_ANISOTROPIC"    : "maximum anisotropic";
        // clang-format on
        default:
            UNEXPECTED("Unexpected filter type (", Uint32{FilterType}, ")");
            return "UNKNOWN";
    }
}